

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O2

void tcg_gen_gvec_ands_m68k
               (TCGContext_conflict2 *tcg_ctx,uint vece,uint32_t dofs,uint32_t aofs,TCGv_i64 c,
               uint32_t oprsz,uint32_t maxsz)

{
  TCGv_i64 out;
  uintptr_t o;
  
  out = tcg_temp_new_i64(tcg_ctx);
  gen_dup_i64(tcg_ctx,vece,out,c);
  tcg_gen_gvec_2s_m68k(tcg_ctx,dofs,aofs,oprsz,maxsz,out,&gop_ands);
  tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(out + (long)tcg_ctx));
  return;
}

Assistant:

void tcg_gen_gvec_ands(TCGContext *tcg_ctx, unsigned vece, uint32_t dofs, uint32_t aofs,
                       TCGv_i64 c, uint32_t oprsz, uint32_t maxsz)
{
    TCGv_i64 tmp = tcg_temp_new_i64(tcg_ctx);
    gen_dup_i64(tcg_ctx, vece, tmp, c);
    tcg_gen_gvec_2s(tcg_ctx, dofs, aofs, oprsz, maxsz, tmp, &gop_ands);
    tcg_temp_free_i64(tcg_ctx, tmp);
}